

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> __thiscall
anon_unknown.dwarf_6d54c::BuildSystemFileDelegate::lookupTool
          (BuildSystemFileDelegate *this,StringRef name)

{
  _func_int **pp_Var1;
  undefined **ppuVar2;
  long in_RCX;
  long *plVar3;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> *tool;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _func_int **local_38;
  StringRef local_30;
  
  plVar3 = (long *)name.Length;
  local_30.Data = (char *)plVar3;
  (**(code **)(**(long **)(*(long *)(name.Data + 8) + 8) + 0x20))();
  if ((this->super_BuildFileDelegate)._vptr_BuildFileDelegate != (_func_int **)0x0) {
    return (__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
            )(__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
              )this;
  }
  (this->super_BuildFileDelegate)._vptr_BuildFileDelegate = (_func_int **)0x0;
  if (0xd < in_RCX) {
    if (in_RCX == 0xe) {
      if (*(long *)((long)plVar3 + 6) == 0x7972617262696c2d && *plVar3 == 0x6c2d646572616873) {
        llvm::make_unique<(anonymous_namespace)::SharedLibraryTool,llvm::StringRef&>
                  ((llvm *)&local_38,&local_30);
      }
      else {
        if (*(long *)((long)plVar3 + 6) != 0x72656c69706d6f63 || *plVar3 != 0x6f632d7466697773)
        goto LAB_0011b029;
        llvm::make_unique<(anonymous_namespace)::SwiftCompilerTool,llvm::StringRef&>
                  ((llvm *)&local_38,&local_30);
      }
    }
    else {
      if ((in_RCX != 0x12) ||
         (auVar4[0] = -((char)*plVar3 == 's'), auVar4[1] = -(*(char *)((long)plVar3 + 1) == 't'),
         auVar4[2] = -(*(char *)((long)plVar3 + 2) == 'a'),
         auVar4[3] = -(*(char *)((long)plVar3 + 3) == 'l'),
         auVar4[4] = -(*(char *)((long)plVar3 + 4) == 'e'),
         auVar4[5] = -(*(char *)((long)plVar3 + 5) == '-'),
         auVar4[6] = -(*(char *)((long)plVar3 + 6) == 'f'),
         auVar4[7] = -(*(char *)((long)plVar3 + 7) == 'i'), auVar4[8] = -((char)plVar3[1] == 'l'),
         auVar4[9] = -(*(char *)((long)plVar3 + 9) == 'e'),
         auVar4[10] = -(*(char *)((long)plVar3 + 10) == '-'),
         auVar4[0xb] = -(*(char *)((long)plVar3 + 0xb) == 'r'),
         auVar4[0xc] = -(*(char *)((long)plVar3 + 0xc) == 'e'),
         auVar4[0xd] = -(*(char *)((long)plVar3 + 0xd) == 'm'),
         auVar4[0xe] = -(*(char *)((long)plVar3 + 0xe) == 'o'),
         auVar4[0xf] = -(*(char *)((long)plVar3 + 0xf) == 'v'),
         auVar5[0] = -((char)(short)plVar3[2] == 'a'),
         auVar5[1] = -((char)((ushort)(short)plVar3[2] >> 8) == 'l'), auVar5[2] = 0xff,
         auVar5[3] = 0xff, auVar5[4] = 0xff, auVar5[5] = 0xff, auVar5[6] = 0xff, auVar5[7] = 0xff,
         auVar5[8] = 0xff, auVar5[9] = 0xff, auVar5[10] = 0xff, auVar5[0xb] = 0xff,
         auVar5[0xc] = 0xff, auVar5[0xd] = 0xff, auVar5[0xe] = 0xff, auVar5[0xf] = 0xff,
         auVar5 = auVar5 & auVar4,
         (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_0011b029;
      llvm::make_unique<(anonymous_namespace)::StaleFileRemovalTool,llvm::StringRef&>
                ((llvm *)&local_38,&local_30);
    }
    goto LAB_0011b0bd;
  }
  if (in_RCX == 5) {
    if (*(char *)((long)plVar3 + 4) == 'l' && (int)*plVar3 == 0x6c656873) {
      pp_Var1 = (_func_int **)operator_new(0x30);
      *pp_Var1 = (_func_int *)&PTR__Tool_001e7228;
      pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
      if (plVar3 == (long *)0x0) {
        pp_Var1[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var1 + 3) = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(pp_Var1 + 1),plVar3,(long)plVar3 + 5);
      }
      *pp_Var1 = (_func_int *)&PTR__Tool_001e5e38;
      *(undefined1 *)(pp_Var1 + 5) = 1;
      goto LAB_0011b0f9;
    }
    if (*(char *)((long)plVar3 + 4) == 'y' && (int)*plVar3 == 0x6e6f6870) {
      pp_Var1 = (_func_int **)operator_new(0x28);
      *pp_Var1 = (_func_int *)&PTR__Tool_001e7228;
      pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
      if (plVar3 == (long *)0x0) {
        pp_Var1[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var1 + 3) = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(pp_Var1 + 1),plVar3,(long)plVar3 + 5);
      }
      ppuVar2 = &PTR__Tool_001e5e80;
    }
    else if (*(char *)((long)plVar3 + 4) == 'g' && (int)*plVar3 == 0x6e616c63) {
      pp_Var1 = (_func_int **)operator_new(0x28);
      *pp_Var1 = (_func_int *)&PTR__Tool_001e7228;
      pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
      if (plVar3 == (long *)0x0) {
        pp_Var1[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var1 + 3) = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(pp_Var1 + 1),plVar3,(long)plVar3 + 5);
      }
      ppuVar2 = &PTR__Tool_001e5fb8;
    }
    else {
      if (*(char *)((long)plVar3 + 4) != 'r' || (int)*plVar3 != 0x69646b6d) goto LAB_0011ae83;
      pp_Var1 = (_func_int **)operator_new(0x28);
      *pp_Var1 = (_func_int *)&PTR__Tool_001e7228;
      pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
      if (plVar3 == (long *)0x0) {
        pp_Var1[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var1 + 3) = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(pp_Var1 + 1),plVar3,(long)plVar3 + 5);
      }
      ppuVar2 = &PTR__Tool_001e6130;
    }
    *pp_Var1 = (_func_int *)ppuVar2;
LAB_0011b0f9:
    (this->super_BuildFileDelegate)._vptr_BuildFileDelegate = pp_Var1;
    return (__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
            )(__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
              )this;
  }
LAB_0011ae83:
  if (in_RCX == 7) {
    if (*(int *)((long)plVar3 + 3) == 0x6b6e696c && (int)*plVar3 == 0x6c6d7973) {
      llvm::make_unique<(anonymous_namespace)::SymlinkTool,llvm::StringRef&>
                ((llvm *)&local_38,&local_30);
    }
    else {
      if (*(int *)((long)plVar3 + 3) != 0x65766968 || (int)*plVar3 != 0x68637261) goto LAB_0011b029;
      llvm::make_unique<(anonymous_namespace)::ArchiveTool,llvm::StringRef&>
                ((llvm *)&local_38,&local_30);
    }
LAB_0011b0bd:
    (this->super_BuildFileDelegate)._vptr_BuildFileDelegate = local_38;
  }
  else {
LAB_0011b029:
    (this->super_BuildFileDelegate)._vptr_BuildFileDelegate = (_func_int **)0x0;
  }
  return (__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Tool>
BuildSystemFileDelegate::lookupTool(StringRef name) {
  // First, give the client an opportunity to create the tool.
  if (auto tool = getSystemDelegate().lookupTool(name)) {
    return tool;
  }

  // Otherwise, look for one of the builtin tool definitions.
  if (name == "shell") {
    return llvm::make_unique<ShellTool>(name);
  } else if (name == "phony") {
    return llvm::make_unique<PhonyTool>(name);
  } else if (name == "clang") {
    return llvm::make_unique<ClangTool>(name);
  } else if (name == "mkdir") {
    return llvm::make_unique<MkdirTool>(name);
  } else if (name == "symlink") {
    return llvm::make_unique<SymlinkTool>(name);
  } else if (name == "archive") {
    return llvm::make_unique<ArchiveTool>(name);
  } else if (name == "shared-library") {
    return llvm::make_unique<SharedLibraryTool>(name);
  } else if (name == "stale-file-removal") {
    return llvm::make_unique<StaleFileRemovalTool>(name);
  } else if (name == "swift-compiler") {
    return llvm::make_unique<SwiftCompilerTool>(name);
  }

  return nullptr;
}